

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htable.c
# Opt level: O2

_Bool htable_add(htable *ht,size_t hash,void *p)

{
  undefined1 auVar1 [16];
  uintptr_t *puVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  uintptr_t *puVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  byte bVar10;
  uint uVar11;
  void *pvVar12;
  ulong uVar13;
  long lVar14;
  undefined1 auVar15 [16];
  
  uVar13 = ht->elems + 1;
  if (ht->max < uVar13) {
    uVar5 = ht->bits;
    puVar2 = ht->table;
    uVar11 = uVar5 + 1;
    bVar10 = (byte)uVar11;
    puVar6 = (uintptr_t *)calloc((long)(1 << (bVar10 & 0x1f)),8);
    ht->table = puVar6;
    if (puVar6 == (uintptr_t *)0x0) {
      ht->table = puVar2;
      return false;
    }
    ht->bits = uVar11;
    ht->max = (ulong)(3L << (bVar10 & 0x3f)) >> 2;
    ht->max_with_deleted = (ulong)(9L << (bVar10 & 0x3f)) / 10;
    if ((ht->perfect_bit == 0) && (ht->common_mask != 0)) {
      uVar8 = 0;
      do {
        if (uVar8 == 0x40) goto LAB_00113d20;
        bVar10 = (byte)uVar8;
        uVar9 = uVar8 & 0x3f;
        uVar8 = uVar8 + 1;
      } while ((ht->common_mask >> uVar9 & 1) == 0);
      ht->perfect_bit = 1L << (bVar10 & 0x3f);
    }
LAB_00113d20:
    if (puVar2 != &ht->perfect_bit) {
      for (uVar11 = 0; uVar11 >> ((byte)uVar5 & 0x3f) == 0; uVar11 = uVar11 + 1) {
        if (1 < puVar2[uVar11]) {
          pvVar12 = (void *)(puVar2[uVar11] & ~ht->common_mask | ht->common_bits);
          sVar7 = (*ht->rehash)(pvVar12,ht->priv);
          ht_add(ht,pvVar12,sVar7);
        }
      }
      free(puVar2);
      uVar13 = ht->elems + 1;
    }
    ht->deleted = 0;
    sVar7 = 0;
  }
  else {
    sVar7 = ht->deleted;
  }
  if (ht->max_with_deleted < uVar13 + sVar7) {
    lVar14 = -1;
    do {
      lVar4 = lVar14 + 1;
      lVar14 = lVar14 + 1;
    } while (ht->table[lVar4] != 0);
    for (uVar13 = 0; bVar10 = (byte)ht->bits, uVar13 >> (bVar10 & 0x3f) == 0; uVar13 = uVar13 + 1) {
      uVar5 = ~(-1 << (bVar10 & 0x1f)) & (uint)lVar14;
      puVar2 = ht->table;
      uVar8 = puVar2[uVar5];
      if (uVar8 != 0) {
        if (uVar8 == 1) {
          puVar2[uVar5] = 0;
        }
        else if ((ht->perfect_bit & uVar8) == 0) {
          pvVar12 = (void *)(uVar8 & ~ht->common_mask | ht->common_bits);
          puVar2[uVar5] = 0;
          sVar7 = (*ht->rehash)(pvVar12,ht->priv);
          ht_add(ht,pvVar12,sVar7);
        }
      }
      lVar14 = lVar14 + 1;
    }
    ht->deleted = 0;
  }
  if (p == (void *)0x0) {
    __assert_fail("p",
                  "/workspace/llm4binary/github/license_c_cmakelists/stricaud[P]faup/src/lib/hash/htable.c"
                  ,0x109,"_Bool htable_add(struct htable *, size_t, const void *)");
  }
  uVar8 = ht->common_mask & (ulong)p;
  uVar13 = ht->common_bits;
  if (uVar8 != uVar13) {
    if (ht->elems == 0) {
      uVar13 = 0x3f;
      do {
        uVar9 = uVar13;
        uVar8 = 0;
        if ((int)uVar9 == 0) break;
        uVar13 = (ulong)((int)uVar9 - 1);
        uVar8 = uVar9;
      } while (((ulong)p >> (uVar9 & 0x3f) & 1) == 0);
      bVar10 = (byte)uVar8 & 0x3f;
      ht->common_mask = -2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10;
      ht->common_bits = (ulong)p & ~(1L << (uVar8 & 0x3f));
      ht->perfect_bit = 1;
    }
    else {
      uVar8 = uVar8 ^ uVar13;
      uVar5 = ht->bits;
      uVar9 = ~uVar8;
      for (uVar11 = 0; uVar11 >> ((byte)uVar5 & 0x3f) == 0; uVar11 = uVar11 + 1) {
        uVar3 = ht->table[uVar11];
        if (1 < uVar3) {
          ht->table[uVar11] = uVar3 & uVar9 | uVar13 & uVar8;
        }
      }
      auVar1._0_8_ = ht->common_mask;
      auVar1._8_8_ = ht->common_bits;
      auVar15._8_4_ = (int)uVar9;
      auVar15._0_8_ = uVar9;
      auVar15._12_4_ = (int)(uVar9 >> 0x20);
      ht->common_mask = SUB168(auVar15 & auVar1,0);
      ht->common_bits = SUB168(auVar15 & auVar1,8);
      ht->perfect_bit = ht->perfect_bit & uVar9;
    }
  }
  ht_add(ht,p,hash);
  ht->elems = ht->elems + 1;
  return true;
}

Assistant:

bool htable_add(struct htable *ht, size_t hash, const void *p)
{
	if (ht->elems+1 > ht->max && !double_table(ht))
		return false;
	if (ht->elems+1 + ht->deleted > ht->max_with_deleted)
		rehash_table(ht);
	assert(p);
	if (((uintptr_t)p & ht->common_mask) != ht->common_bits)
		update_common(ht, p);

	ht_add(ht, p, hash);
	ht->elems++;
	return true;
}